

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O3

void nn_ep_clear_error(nn_ep *self)

{
  if (self->last_errno != 0) {
    nn_sock_stat_increment(self->sock,0xcb,-1);
    self->last_errno = 0;
    nn_sock_report_error(self->sock,self,0);
    return;
  }
  return;
}

Assistant:

void nn_ep_clear_error (struct nn_ep *self)
{
    if (self->last_errno == 0)
        /*  Error is already clear, no need to report it  */
        return;
    nn_sock_stat_increment (self->sock, NN_STAT_CURRENT_EP_ERRORS, -1);
    self->last_errno = 0;
    nn_sock_report_error (self->sock, self, 0);
}